

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

int32_t decode_unicode_escape(char *str)

{
  char cVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  if (*str != 'u') {
    __assert_fail("str[0] == \'u\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/load.c"
                  ,0x117,"int32_t decode_unicode_escape(const char *)");
  }
  lVar3 = 0;
  iVar2 = 0;
  do {
    cVar1 = str[lVar3 + 1];
    iVar4 = (int)cVar1;
    iVar2 = iVar2 * 0x10;
    if ((byte)(cVar1 - 0x30U) < 10) {
      iVar2 = iVar2 + iVar4 + -0x30;
    }
    else if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      iVar2 = iVar2 + iVar4 + -0x57;
    }
    else {
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        return -1;
      }
      iVar2 = iVar2 + iVar4 + -0x37;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return iVar2;
}

Assistant:

static int32_t decode_unicode_escape(const char *str) {
    int i;
    int32_t value = 0;

    assert(str[0] == 'u');

    for (i = 1; i <= 4; i++) {
        char c = str[i];
        value <<= 4;
        if (l_isdigit(c))
            value += c - '0';
        else if (l_islower(c))
            value += c - 'a' + 10;
        else if (l_isupper(c))
            value += c - 'A' + 10;
        else
            return -1;
    }

    return value;
}